

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSimSat.c
# Opt level: O2

void Ssw_ManResimulateWord(Ssw_Man_t *p,Aig_Obj_t *pCand,Aig_Obj_t *pRepr,int f)

{
  uint __line;
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  abctime aVar5;
  char *__assertion;
  
  aVar4 = Abc_Clock();
  Ssw_SmlAssignDist1Plus(p->pSml,p->pPatWords);
  Ssw_SmlSimulateOne(p->pSml);
  iVar1 = Ssw_ClassesRefineConst1(p->ppClasses,1);
  iVar2 = Ssw_ClassesRefine(p->ppClasses,1);
  iVar3 = Aig_ObjIsConst1(pRepr);
  if (iVar3 == 0) {
    if (iVar2 != 0) goto LAB_005174fa;
    __assertion = "RetValue2";
    __line = 0x70;
  }
  else {
    if (iVar1 != 0) {
LAB_005174fa:
      aVar5 = Abc_Clock();
      p->timeSimSat = p->timeSimSat + (aVar5 - aVar4);
      return;
    }
    __assertion = "RetValue1";
    __line = 0x6a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSimSat.c"
                ,__line,"void Ssw_ManResimulateWord(Ssw_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int)");
}

Assistant:

void Ssw_ManResimulateWord( Ssw_Man_t * p, Aig_Obj_t * pCand, Aig_Obj_t * pRepr, int f )
{
    int RetValue1, RetValue2;
    abctime clk = Abc_Clock();
    // set the PI simulation information
    Ssw_SmlAssignDist1Plus( p->pSml, p->pPatWords );
    // simulate internal nodes
    Ssw_SmlSimulateOne( p->pSml );
    // check equivalence classes
    RetValue1 = Ssw_ClassesRefineConst1( p->ppClasses, 1 );
    RetValue2 = Ssw_ClassesRefine( p->ppClasses, 1 );
    // make sure refinement happened
    if ( Aig_ObjIsConst1(pRepr) )
    {
        assert( RetValue1 );
        if ( RetValue1 == 0 )
            Abc_Print( 1, "\nSsw_ManResimulateWord() Error: RetValue1 does not hold.\n" );
    }
    else
    {
        assert( RetValue2 );
        if ( RetValue2 == 0 )
            Abc_Print( 1, "\nSsw_ManResimulateWord() Error: RetValue2 does not hold.\n" );
    }
p->timeSimSat += Abc_Clock() - clk;
}